

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::LTAircraft(LTAircraft *this,LTFlightData *inFd)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  logLevelTy lVar4;
  FDKeyTy *pFVar5;
  FlightModel *pFVar6;
  Doc8643 *pDVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  LTFlightData *in_RSI;
  Aircraft *in_RDI;
  system_error *e;
  FDStaticData statCopy;
  FDDynamicData dynCopy;
  lock_guard<std::recursive_mutex> lock;
  int cycle;
  mutex_type *in_stack_fffffffffffff508;
  Aircraft *in_stack_fffffffffffff510;
  FDStaticData *in_stack_fffffffffffff518;
  undefined7 in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff537;
  double in_stack_fffffffffffff538;
  allocator<char> *in_stack_fffffffffffff540;
  char *in_stack_fffffffffffff548;
  MovingParam *in_stack_fffffffffffff550;
  initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff558;
  LTFlightData *in_stack_fffffffffffff568;
  double dVar12;
  LTFlightData *in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff58c;
  LTAircraft *in_stack_fffffffffffff590;
  string *in_stack_fffffffffffff598;
  XPMPPlaneID in_stack_fffffffffffff5a4;
  string *in_stack_fffffffffffff5a8;
  undefined7 in_stack_fffffffffffff5b0;
  undefined1 in_stack_fffffffffffff5b7;
  LTFlightData *in_stack_fffffffffffff5b8;
  Aircraft *in_stack_fffffffffffff5c0;
  string *local_990;
  string *local_978;
  string *local_960;
  long local_740;
  long lStack_738;
  XPMPTransponderMode local_730;
  LTChannel *local_700;
  allocator<char> local_6e9;
  string local_6e8 [38];
  allocator<char> local_6c2;
  undefined1 local_6c1;
  string local_6c0 [248];
  LTAircraft *in_stack_fffffffffffffa38;
  string local_520 [32];
  string local_500 [32];
  string *local_4e0;
  undefined8 local_4d8;
  string local_4d0 [32];
  string local_4b0 [38];
  allocator<char> local_48a;
  undefined1 local_489;
  string *local_2f0;
  string local_2e8 [32];
  undefined1 local_2c8 [32];
  string *local_2a8;
  undefined8 local_2a0;
  string local_298 [32];
  string local_278 [38];
  allocator<char> local_252;
  undefined1 local_251;
  string local_210 [360];
  string *local_a8;
  string local_a0 [32];
  string local_80 [32];
  string *local_60;
  undefined8 local_58;
  string local_50 [32];
  string local_30 [32];
  LTFlightData *local_10;
  
  local_251 = 1;
  local_a8 = local_a0;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_a8,(string *)&dataRefs.cslFixAcIcaoType);
  local_a8 = local_80;
  LTFlightData::WaitForSafeCopyStat(in_stack_fffffffffffff568);
  std::__cxx11::string::string(local_80,local_210);
  local_251 = 0;
  local_60 = local_a0;
  local_58 = 2;
  str_first_non_empty(in_stack_fffffffffffff558);
  std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  local_489 = 1;
  local_2f0 = local_2e8;
  std::__cxx11::string::string(local_2f0,(string *)&dataRefs.cslFixOpIcao);
  local_2f0 = (string *)local_2c8;
  LTFlightData::WaitForSafeCopyStat(in_stack_fffffffffffff568);
  LTFlightData::FDStaticData::airlineCode_abi_cxx11_(in_stack_fffffffffffff518);
  local_489 = 0;
  local_2a8 = local_2e8;
  local_2a0 = 2;
  str_first_non_empty(in_stack_fffffffffffff558);
  std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  local_6c1 = 1;
  std::__cxx11::string::string(local_520,(string *)&dataRefs.cslFixLivery);
  LTFlightData::WaitForSafeCopyStat(in_stack_fffffffffffff568);
  std::__cxx11::string::string(local_500,local_6c0);
  local_6c1 = 0;
  local_4e0 = local_520;
  local_4d8 = 2;
  str_first_non_empty(in_stack_fffffffffffff558);
  std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  pFVar5 = LTFlightData::key(local_10);
  if (pFVar5->num < 0xffffff) {
    LTFlightData::key(local_10);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff550,in_stack_fffffffffffff548,in_stack_fffffffffffff540);
  XPMP2::Aircraft::Aircraft
            (in_stack_fffffffffffff5c0,(string *)in_stack_fffffffffffff5b8,
             (string *)CONCAT17(in_stack_fffffffffffff5b7,in_stack_fffffffffffff5b0),
             in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a4,in_stack_fffffffffffff598);
  std::__cxx11::string::~string(local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_6c2);
  std::__cxx11::string::~string(local_4d0);
  local_960 = (string *)&local_4e0;
  do {
    local_960 = local_960 + -0x20;
    std::__cxx11::string::~string(local_960);
  } while (local_960 != local_520);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)in_stack_fffffffffffff510);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator(&local_48a);
  std::__cxx11::string::~string(local_298);
  local_978 = (string *)&local_2a8;
  do {
    local_978 = local_978 + -0x20;
    std::__cxx11::string::~string(local_978);
  } while (local_978 != local_2e8);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)in_stack_fffffffffffff510);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_252);
  std::__cxx11::string::~string(local_50);
  local_990 = (string *)&local_60;
  do {
    local_990 = local_990 + -0x20;
    std::__cxx11::string::~string(local_990);
  } while (local_990 != local_a0);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)in_stack_fffffffffffff510);
  in_RDI->_vptr_Aircraft = (_func_int **)&PTR__LTAircraft_0046c818;
  in_RDI[1]._vptr_Aircraft = (_func_int **)local_10;
  pFVar6 = FlightModel::FindFlightModel
                     (in_stack_fffffffffffff5b8,(bool)in_stack_fffffffffffff5b7,
                      (string **)in_stack_fffffffffffff5a8);
  *(FlightModel **)&in_RDI[1].modeS_id = pFVar6;
  pDVar7 = Doc8643::get(&in_stack_fffffffffffff518->reg);
  *(Doc8643 **)&in_RDI[1].acIcaoType = pDVar7;
  *(undefined1 *)&in_RDI[1].acIcaoType._M_string_length = 0;
  std::deque<positionTy,_std::allocator<positionTy>_>::deque
            ((deque<positionTy,_std::allocator<positionTy>_> *)0x1928e0);
  std::__cxx11::string::string((string *)&in_RDI[1].drawInfo);
  positionTy::positionTy((positionTy *)&in_RDI[1].v_y);
  vectorTy::vectorTy((vectorTy *)in_RDI[1].colLabel);
  *(undefined8 *)&in_RDI[1].aiPrio = 0;
  *(undefined1 *)&in_RDI[1].acRadar.size = 0;
  in_RDI[1].acRadar.code = 0x7ff8000000000000;
  *(undefined8 *)&in_RDI[1].acRadar.mode = 0;
  *(undefined1 *)
   &in_RDI[1].listContrail.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
    super__List_node_base._M_next = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].listContrail.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
           super__List_node_base._M_next + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].listContrail.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
           super__List_node_base._M_next + 2) = 0;
  AccelParam::AccelParam
            ((AccelParam *)
             &in_RDI[1].listContrail.super__List_base<void_*,_std::allocator<void_*>_>._M_impl.
              _M_node.super__List_node_base._M_prev);
  BezierCurve::BezierCurve((BezierCurve *)in_stack_fffffffffffff510);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  MovingParam::MovingParam
            (in_stack_fffffffffffff550,(double)in_stack_fffffffffffff548,
             (double)in_stack_fffffffffffff540,in_stack_fffffffffffff538,
             (bool)in_stack_fffffffffffff537);
  in_RDI[2].lat1s = 0.0;
  in_RDI[2].lon1s = 0.0;
  vectorTy::vectorTy((vectorTy *)&in_RDI[2].alt1s_ft);
  *(undefined1 *)
   &in_RDI[2].listInst.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node._M_size = 0
  ;
  *(undefined1 *)
   ((long)&in_RDI[2].listInst.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
           _M_size + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[2].listInst.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
           _M_size + 2) = 1;
  *(undefined1 *)
   ((long)&in_RDI[2].listInst.super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
           _M_size + 3) = 1;
  std::__cxx11::string::string((string *)&in_RDI[2].tcasTargetIdx);
  positionTy::positionTy((positionTy *)&in_RDI[2].mapX);
  *(undefined4 *)(in_RDI[2].aSndCh + 1) = 0;
  iVar3 = XPLMGetCycleNumber();
  if (iVar3 != currCycle.num) {
    NextCycle((int)in_stack_fffffffffffff510);
  }
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffff510,in_stack_fffffffffffff508
            );
  LTFlightData::WaitForSafeCopyDyn
            (in_stack_fffffffffffff570,SUB81((ulong)in_stack_fffffffffffff568 >> 0x38,0));
  LTFlightData::WaitForSafeCopyStat(in_stack_fffffffffffff568);
  bVar2 = LTFlightData::FDStaticData::isStaticObject((FDStaticData *)0x19310c);
  *(bool *)&in_RDI[1].acIcaoType._M_string_length = bVar2;
  in_RDI->aiPrio = 0;
  in_RDI->bClampToGround = false;
  (in_RDI->acRadar).mode = local_730;
  (in_RDI->acRadar).size = local_740;
  (in_RDI->acRadar).code = lStack_738;
  LabelUpdate((LTAircraft *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
  CalcLabelInternal(in_stack_fffffffffffff590,
                    (FDStaticData *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  MovingParam::SetVal((MovingParam *)in_stack_fffffffffffff510,(double)in_stack_fffffffffffff508);
  MovingParam::SetVal((MovingParam *)in_stack_fffffffffffff510,(double)in_stack_fffffffffffff508);
  bVar2 = CalcPPos(in_stack_fffffffffffffa38);
  if ((!bVar2) && (lVar4 = DataRefs::GetLogLevel(&dataRefs), (int)lVar4 < 4)) {
    LTFlightData::key((LTFlightData *)in_RDI[1]._vptr_Aircraft);
    pcVar8 = LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x193224);
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x514,"LTAircraft",logERR,"Could not calculate position when creating aircraft %s",
           pcVar8);
  }
  bVar2 = XPMP2::Aircraft::IsOnGrnd(in_RDI);
  if (bVar2) {
    MovingParam::SetVal((MovingParam *)in_stack_fffffffffffff510,(double)in_stack_fffffffffffff508);
    MovingParam::SetVal((MovingParam *)in_stack_fffffffffffff510,(double)in_stack_fffffffffffff508);
  }
  DataRefs::IncNumAc(&dataRefs);
  lVar4 = DataRefs::GetLogLevel(&dataRefs);
  if ((int)lVar4 < 2) {
    uVar9 = std::__cxx11::string::c_str();
    uVar10 = std::__cxx11::string::c_str();
    XPMP2::Aircraft::GetModelName_abi_cxx11_(in_stack_fffffffffffff510);
    in_stack_fffffffffffff510 = (Aircraft *)std::__cxx11::string::c_str();
    uVar11 = std::__cxx11::string::c_str();
    dVar1 = in_RDI[2].alt1s_ft;
    dVar12 = *(double *)&in_RDI[2].tsResetTouchDown / 1852.0;
    if (local_700 == (LTChannel *)0x0) {
      pcVar8 = "?";
    }
    else {
      pcVar8 = LTChannel::ChName(local_700);
    }
    LogMsg(SUB84(dVar1,0),(int)dVar12,
           "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x524,"LTAircraft",1,
           "Added aircraft %s, operator \'%s\', a/c model \'%s\', flight model [%s], bearing %.0f, distance %.1fnm, from channel %s"
           ,uVar9,uVar10,in_stack_fffffffffffff510,uVar11,pcVar8);
  }
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)in_stack_fffffffffffff510);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1934c1);
  return;
}

Assistant:

LTAircraft::LTAircraft(LTFlightData& inFd) :
// Base class -> this registers with XPMP API for actual display in XP!
// repeated calls to WaitForSafeCopyStat look inefficient, but if the lock is held by the calling function already then these are quick recursive calls
// Using registration as livery indicator, allows for different liveries per actual airframe
// Debug options to set fixed type/op/livery take precedence
XPMP2::Aircraft(str_first_non_empty({dataRefs.cslFixAcIcaoType, inFd.WaitForSafeCopyStat().acTypeIcao}).c_str(),
                str_first_non_empty({dataRefs.cslFixOpIcao,     inFd.WaitForSafeCopyStat().airlineCode()}).c_str(),
                str_first_non_empty({dataRefs.cslFixLivery,     inFd.WaitForSafeCopyStat().reg}).c_str(),
                inFd.key().num < MAX_MODE_S_ID ? (XPMPPlaneID)inFd.key().num : 0),      // OGN Ids can be larger than MAX_MODE_S_ID, in that case let XPMP2 assign a synthetic id
// class members
fd(inFd),
pMdl(&FlightModel::FindFlightModel(inFd, true)),      // find matching flight model
pDoc8643(&Doc8643::get(acIcaoType)),
tsLastCalcRequested(0),
phase(FPH_UNKNOWN),
rotateTs(NAN),
vsi(0.0),
bArtificalPos(false),
heading(pMdl->TAXI_TURN_TIME, 360, 0, true),
corrAngle(pMdl->FLIGHT_TURN_TIME / 2.0, 90, -90, false),
gear(pMdl->GEAR_DURATION),
flaps(pMdl->FLAPS_DURATION),
pitch((pMdl->PITCH_MAX-pMdl->PITCH_MIN)/pMdl->PITCH_RATE, pMdl->PITCH_MAX, pMdl->PITCH_MIN),
reversers(MDL_REVERSERS_TIME),
spoilers(MDL_SPOILERS_TIME),
tireRpm(MDL_TIRE_SLOW_TIME, MDL_TIRE_MAX_RPM),
gearDeflection(MDL_GEAR_DEFL_TIME, pMdl->GEAR_DEFLECTION),
probeNextTs(0), terrainAlt_m(0.0)
{
    // for some calcs we need correct timestamps _before_ first draw already
    // so make sure the currCycle struct is up-to-date
    int cycle = XPLMGetCycleNumber();
    if ( cycle != currCycle.num )            // new cycle!
        NextCycle(cycle);

    try {
        // access guarded by a mutex (will be a recursive call: creator/caller should be holding the lock already)
        std::lock_guard<std::recursive_mutex> lock (fd.dataAccessMutex);
        
        // get copy of dynamice and static data for constructor purposes
        LTFlightData::FDDynamicData dynCopy (fd.WaitForSafeCopyDyn());
        LTFlightData::FDStaticData statCopy (fd.WaitForSafeCopyStat());
        bStaticObject = statCopy.isStaticObject();
        
        // init
        aiPrio = 0;
        bClampToGround = false;
        
        // positional data / radar: just copy from fd for a start
        acRadar = dynCopy.radar;

        // standard label
        LabelUpdate();

        // standard internal label (e.g. for logging) is transpIcao + ac type + another id if available
        CalcLabelInternal(statCopy);
        
        // init moving params where necessary
        pitch.SetVal(0);
        corrAngle.SetVal(0);
        
        // calculate our first position, must also succeed
        if (!CalcPPos())
            LOG_MSG(logERR,ERR_AC_CALC_PPOS,fd.key().c_str());
        
        // if we start on the ground then have the gear out already
        if (IsOnGrnd()) {
            gear.SetVal(gear.defMax);
            gearDeflection.SetVal((gearDeflection.defMin+gearDeflection.defMax)/2);
        }
        
        // tell the world we've added something
        dataRefs.IncNumAc();
        LOG_MSG(logINFO,INFO_AC_ADDED,
                labelInternal.c_str(),
                statCopy.opIcao.c_str(),
                GetModelName().c_str(),
                pMdl->modelName.c_str(),
                vecView.angle, vecView.dist/M_per_NM,
                dynCopy.pChannel ? dynCopy.pChannel->ChName() : "?");
        
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
}